

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPrimalHeuristics.cpp
# Opt level: O2

void __thiscall
HeuristicNeighbourhood::HeuristicNeighbourhood
          (HeuristicNeighbourhood *this,HighsMipSolver *mipsolver,HighsDomain *localdom)

{
  double *pdVar1;
  double dVar2;
  HighsMipSolverData *pHVar3;
  int *piVar4;
  int *piVar5;
  pointer pdVar6;
  pointer pdVar7;
  size_t sVar8;
  int iVar9;
  int *piVar10;
  
  this->localdom = localdom;
  this->numFixed = 0;
  HighsHashTable<int,_void>::HighsHashTable(&this->fixedCols);
  sVar8 = (long)(localdom->domchgstack_).
                super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(localdom->domchgstack_).
                super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
                super__Vector_impl_data._M_start >> 4;
  this->startCheckedChanges = sVar8;
  this->nCheckedChanges = sVar8;
  pHVar3 = (mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  piVar5 = *(pointer *)
            ((long)&(pHVar3->integral_cols).super__Vector_base<int,_std::allocator<int>_> + 8);
  iVar9 = this->numFixed;
  pdVar6 = (localdom->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (localdom->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = *(int **)&(pHVar3->integral_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl;
  for (piVar10 = piVar4; piVar10 != piVar5; piVar10 = piVar10 + 1) {
    dVar2 = pdVar6[*piVar10];
    pdVar1 = pdVar7 + *piVar10;
    if ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1))) {
      iVar9 = iVar9 + 1;
      this->numFixed = iVar9;
    }
  }
  this->numTotal = (int)((ulong)((long)piVar5 - (long)piVar4) >> 2) - iVar9;
  return;
}

Assistant:

HeuristicNeighbourhood(HighsMipSolver& mipsolver, HighsDomain& localdom)
      : localdom(localdom),
        numFixed(0),
        startCheckedChanges(localdom.getDomainChangeStack().size()),
        nCheckedChanges(startCheckedChanges) {
    for (HighsInt i : mipsolver.mipdata_->integral_cols)
      if (localdom.col_lower_[i] == localdom.col_upper_[i]) ++numFixed;

    numTotal = mipsolver.mipdata_->integral_cols.size() - numFixed;
  }